

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::Parser::GenerateMapEntry
          (Parser *this,MapField *map_field,FieldDescriptorProto *field,
          RepeatedPtrField<google::protobuf::DescriptorProto> *messages)

{
  RepeatedPtrFieldBase *this_00;
  uint uVar1;
  Type TVar2;
  Rep *pRVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  int *piVar7;
  MapField *pMVar8;
  FieldDescriptorProto *pFVar9;
  bool bVar10;
  int iVar11;
  DescriptorProto *obj;
  MessageOptions *pMVar12;
  void *pvVar13;
  FieldDescriptorProto *pFVar14;
  void *pvVar15;
  Type *from;
  LogMessage *other;
  FieldOptions *pFVar16;
  UninterpretedOption *pUVar17;
  undefined8 *puVar18;
  long *plVar19;
  int iVar20;
  Arena *pAVar21;
  undefined1 *puVar22;
  long lVar23;
  string entry_name;
  LogFinisher local_99;
  MapField *local_98;
  undefined1 *local_90;
  undefined8 local_88;
  undefined1 local_80 [16];
  FieldDescriptorProto *local_70;
  LogMessage local_68;
  
  pRVar3 = (messages->super_RepeatedPtrFieldBase).rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_0033e880:
    obj = Arena::CreateMaybeMessage<google::protobuf::DescriptorProto>
                    ((messages->super_RepeatedPtrFieldBase).arena_);
    pvVar15 = internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&messages->super_RepeatedPtrFieldBase,obj);
  }
  else {
    iVar20 = (messages->super_RepeatedPtrFieldBase).current_size_;
    if (pRVar3->allocated_size <= iVar20) goto LAB_0033e880;
    (messages->super_RepeatedPtrFieldBase).current_size_ = iVar20 + 1;
    pvVar15 = pRVar3->elements[iVar20];
  }
  plVar19 = (long *)((ulong)(field->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
  local_90 = local_80;
  local_88 = 0;
  local_80[0] = 0;
  local_98 = map_field;
  local_70 = field;
  std::__cxx11::string::reserve((ulong)&local_90);
  lVar4 = plVar19[1];
  if (lVar4 != 0) {
    lVar5 = *plVar19;
    lVar23 = 0;
    do {
      if (*(char *)(lVar5 + lVar23) != '_') {
        std::__cxx11::string::push_back((char)&local_90);
      }
      lVar23 = lVar23 + 1;
    } while (lVar4 != lVar23);
  }
  std::__cxx11::string::append((char *)&local_90);
  pFVar9 = local_70;
  pMVar8 = local_98;
  *(byte *)(local_70->_has_bits_).has_bits_ = (byte)(local_70->_has_bits_).has_bits_[0] | 4;
  uVar6 = (local_70->super_Message).super_MessageLite._internal_metadata_.ptr_;
  puVar18 = (undefined8 *)(uVar6 & 0xfffffffffffffffc);
  if ((uVar6 & 1) != 0) {
    puVar18 = (undefined8 *)*puVar18;
  }
  internal::ArenaStringPtr::Set(&local_70->type_name_,&local_90,puVar18);
  *(byte *)((long)pvVar15 + 0x10) = *(byte *)((long)pvVar15 + 0x10) | 1;
  puVar18 = (undefined8 *)(*(ulong *)((long)pvVar15 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar15 + 8) & 1) != 0) {
    puVar18 = (undefined8 *)*puVar18;
  }
  internal::ArenaStringPtr::Set((ArenaStringPtr *)((long)pvVar15 + 0xd8),&local_90,puVar18);
  *(byte *)((long)pvVar15 + 0x10) = *(byte *)((long)pvVar15 + 0x10) | 2;
  pMVar12 = *(MessageOptions **)((long)pvVar15 + 0xe0);
  if (pMVar12 == (MessageOptions *)0x0) {
    pAVar21 = (Arena *)(*(ulong *)((long)pvVar15 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar15 + 8) & 1) != 0) {
      pAVar21 = *(Arena **)pAVar21;
    }
    pMVar12 = Arena::CreateMaybeMessage<google::protobuf::MessageOptions>(pAVar21);
    *(MessageOptions **)((long)pvVar15 + 0xe0) = pMVar12;
  }
  *(byte *)(pMVar12->_has_bits_).has_bits_ = (byte)(pMVar12->_has_bits_).has_bits_[0] | 8;
  pMVar12->map_entry_ = true;
  this_00 = (RepeatedPtrFieldBase *)((long)pvVar15 + 0x18);
  piVar7 = *(int **)((long)pvVar15 + 0x28);
  if (piVar7 == (int *)0x0) {
LAB_0033e9ed:
    pFVar14 = Arena::CreateMaybeMessage<google::protobuf::FieldDescriptorProto>(this_00->arena_);
    pvVar13 = internal::RepeatedPtrFieldBase::AddOutOfLineHelper(this_00,pFVar14);
  }
  else {
    iVar20 = *(int *)((long)pvVar15 + 0x20);
    if (*piVar7 <= iVar20) goto LAB_0033e9ed;
    *(int *)((long)pvVar15 + 0x20) = iVar20 + 1;
    pvVar13 = *(void **)(piVar7 + (long)iVar20 * 2 + 2);
  }
  *(byte *)((long)pvVar13 + 0x10) = *(byte *)((long)pvVar13 + 0x10) | 1;
  puVar18 = (undefined8 *)(*(ulong *)((long)pvVar13 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar13 + 8) & 1) != 0) {
    puVar18 = (undefined8 *)*puVar18;
  }
  internal::ArenaStringPtr::Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar13 + 0x18),"key",puVar18);
  bVar10 = FieldDescriptorProto_Label_IsValid(1);
  if (!bVar10) goto LAB_0033edbd;
  uVar1 = *(uint *)((long)pvVar13 + 0x10);
  *(undefined4 *)((long)pvVar13 + 0x54) = 1;
  *(uint *)((long)pvVar13 + 0x10) = uVar1 | 0x240;
  *(undefined4 *)((long)pvVar13 + 0x48) = 1;
  if ((pMVar8->key_type_name)._M_string_length == 0) {
    TVar2 = pMVar8->key_type;
    bVar10 = FieldDescriptorProto_Type_IsValid(TVar2);
    if (!bVar10) goto LAB_0033eddc;
    *(byte *)((long)pvVar13 + 0x11) = *(byte *)((long)pvVar13 + 0x11) | 4;
    *(Type *)((long)pvVar13 + 0x58) = TVar2;
  }
  else {
    *(uint *)((long)pvVar13 + 0x10) = uVar1 | 0x244;
    puVar18 = (undefined8 *)(*(ulong *)((long)pvVar13 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar13 + 8) & 1) != 0) {
      puVar18 = (undefined8 *)*puVar18;
    }
    internal::ArenaStringPtr::Set
              ((ArenaStringPtr *)((long)pvVar13 + 0x28),&pMVar8->key_type_name,puVar18);
  }
  piVar7 = *(int **)((long)pvVar15 + 0x28);
  if (piVar7 == (int *)0x0) {
LAB_0033eacb:
    pFVar14 = Arena::CreateMaybeMessage<google::protobuf::FieldDescriptorProto>(this_00->arena_);
    pvVar15 = internal::RepeatedPtrFieldBase::AddOutOfLineHelper(this_00,pFVar14);
  }
  else {
    iVar20 = *(int *)((long)pvVar15 + 0x20);
    if (*piVar7 <= iVar20) goto LAB_0033eacb;
    *(int *)((long)pvVar15 + 0x20) = iVar20 + 1;
    pvVar15 = *(void **)(piVar7 + (long)iVar20 * 2 + 2);
  }
  *(byte *)((long)pvVar15 + 0x10) = *(byte *)((long)pvVar15 + 0x10) | 1;
  puVar18 = (undefined8 *)(*(ulong *)((long)pvVar15 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar15 + 8) & 1) != 0) {
    puVar18 = (undefined8 *)*puVar18;
  }
  internal::ArenaStringPtr::Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar15 + 0x18),"value",puVar18);
  bVar10 = FieldDescriptorProto_Label_IsValid(1);
  if (bVar10) {
    uVar1 = *(uint *)((long)pvVar15 + 0x10);
    *(undefined4 *)((long)pvVar15 + 0x54) = 1;
    *(uint *)((long)pvVar15 + 0x10) = uVar1 | 0x240;
    *(undefined4 *)((long)pvVar15 + 0x48) = 2;
    if ((pMVar8->value_type_name)._M_string_length == 0) {
      TVar2 = pMVar8->value_type;
      bVar10 = FieldDescriptorProto_Type_IsValid(TVar2);
      if (!bVar10) {
LAB_0033eddc:
        __assert_fail("::PROTOBUF_NAMESPACE_ID::FieldDescriptorProto_Type_IsValid(value)",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.h"
                      ,0x27b0,
                      "void google::protobuf::FieldDescriptorProto::_internal_set_type(::google::protobuf::FieldDescriptorProto_Type)"
                     );
      }
      *(byte *)((long)pvVar15 + 0x11) = *(byte *)((long)pvVar15 + 0x11) | 4;
      *(Type *)((long)pvVar15 + 0x58) = TVar2;
    }
    else {
      *(uint *)((long)pvVar15 + 0x10) = uVar1 | 0x244;
      puVar18 = (undefined8 *)(*(ulong *)((long)pvVar15 + 8) & 0xfffffffffffffffc);
      if ((*(ulong *)((long)pvVar15 + 8) & 1) != 0) {
        puVar18 = (undefined8 *)*puVar18;
      }
      internal::ArenaStringPtr::Set
                ((ArenaStringPtr *)((long)pvVar15 + 0x28),&pMVar8->value_type_name,puVar18);
    }
    puVar22 = (undefined1 *)pFVar9->options_;
    if ((FieldOptions *)puVar22 == (FieldOptions *)0x0) {
      puVar22 = _FieldOptions_default_instance_;
    }
    if (0 < (((FieldOptions *)puVar22)->uninterpreted_option_).super_RepeatedPtrFieldBase.
            current_size_) {
      iVar20 = 0;
      do {
        from = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption>::TypeHandler>
                         (&(((FieldOptions *)puVar22)->uninterpreted_option_).
                           super_RepeatedPtrFieldBase,iVar20);
        if (((from->name_).super_RepeatedPtrFieldBase.current_size_ == 1) &&
           (iVar11 = std::__cxx11::string::compare
                               ((char *)(*(ulong *)((long)((from->name_).super_RepeatedPtrFieldBase.
                                                          rep_)->elements[0] + 0x18) &
                                        0xfffffffffffffffe)), iVar11 == 0)) {
          if ((from->name_).super_RepeatedPtrFieldBase.current_size_ < 1) {
            internal::LogMessage::LogMessage
                      (&local_68,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
                       ,0x358);
            other = internal::LogMessage::operator<<
                              (&local_68,"CHECK failed: (index) < (current_size_): ");
            internal::LogFinisher::operator=(&local_99,other);
            internal::LogMessage::~LogMessage(&local_68);
          }
          if (*(char *)((long)((from->name_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x20)
              == '\0') {
            if (*(int *)((long)pvVar13 + 0x58) == 9) {
              *(byte *)((long)pvVar13 + 0x10) = *(byte *)((long)pvVar13 + 0x10) | 0x20;
              pFVar16 = *(FieldOptions **)((long)pvVar13 + 0x40);
              if (pFVar16 == (FieldOptions *)0x0) {
                pAVar21 = (Arena *)(*(ulong *)((long)pvVar13 + 8) & 0xfffffffffffffffc);
                if ((*(ulong *)((long)pvVar13 + 8) & 1) != 0) {
                  pAVar21 = *(Arena **)pAVar21;
                }
                pFVar16 = Arena::CreateMaybeMessage<google::protobuf::FieldOptions>(pAVar21);
                *(FieldOptions **)((long)pvVar13 + 0x40) = pFVar16;
              }
              pRVar3 = (pFVar16->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_;
              if (pRVar3 == (Rep *)0x0) {
LAB_0033eca0:
                pUVar17 = Arena::CreateMaybeMessage<google::protobuf::UninterpretedOption>
                                    ((pFVar16->uninterpreted_option_).super_RepeatedPtrFieldBase.
                                     arena_);
                pUVar17 = (UninterpretedOption *)
                          internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                                    (&(pFVar16->uninterpreted_option_).super_RepeatedPtrFieldBase,
                                     pUVar17);
              }
              else {
                iVar11 = (pFVar16->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
                if (pRVar3->allocated_size <= iVar11) goto LAB_0033eca0;
                (pFVar16->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ =
                     iVar11 + 1;
                pUVar17 = (UninterpretedOption *)pRVar3->elements[iVar11];
              }
              UninterpretedOption::CopyFrom(pUVar17,from);
            }
            if (*(int *)((long)pvVar15 + 0x58) == 9) {
              *(byte *)((long)pvVar15 + 0x10) = *(byte *)((long)pvVar15 + 0x10) | 0x20;
              pFVar16 = *(FieldOptions **)((long)pvVar15 + 0x40);
              if (pFVar16 == (FieldOptions *)0x0) {
                pAVar21 = (Arena *)(*(ulong *)((long)pvVar15 + 8) & 0xfffffffffffffffc);
                if ((*(ulong *)((long)pvVar15 + 8) & 1) != 0) {
                  pAVar21 = *(Arena **)pAVar21;
                }
                pFVar16 = Arena::CreateMaybeMessage<google::protobuf::FieldOptions>(pAVar21);
                *(FieldOptions **)((long)pvVar15 + 0x40) = pFVar16;
              }
              pRVar3 = (pFVar16->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_;
              if (pRVar3 == (Rep *)0x0) {
LAB_0033ed16:
                pUVar17 = Arena::CreateMaybeMessage<google::protobuf::UninterpretedOption>
                                    ((pFVar16->uninterpreted_option_).super_RepeatedPtrFieldBase.
                                     arena_);
                pUVar17 = (UninterpretedOption *)
                          internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                                    (&(pFVar16->uninterpreted_option_).super_RepeatedPtrFieldBase,
                                     pUVar17);
              }
              else {
                iVar11 = (pFVar16->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
                if (pRVar3->allocated_size <= iVar11) goto LAB_0033ed16;
                (pFVar16->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ =
                     iVar11 + 1;
                pUVar17 = (UninterpretedOption *)pRVar3->elements[iVar11];
              }
              UninterpretedOption::CopyFrom(pUVar17,from);
            }
          }
        }
        puVar22 = (undefined1 *)pFVar9->options_;
        if ((FieldOptions *)puVar22 == (FieldOptions *)0x0) {
          puVar22 = _FieldOptions_default_instance_;
        }
        iVar20 = iVar20 + 1;
      } while (iVar20 < (((FieldOptions *)puVar22)->uninterpreted_option_).
                        super_RepeatedPtrFieldBase.current_size_);
    }
    if (local_90 != local_80) {
      operator_delete(local_90);
    }
    return;
  }
LAB_0033edbd:
  __assert_fail("::PROTOBUF_NAMESPACE_ID::FieldDescriptorProto_Label_IsValid(value)",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.h"
                ,0x2793,
                "void google::protobuf::FieldDescriptorProto::_internal_set_label(::google::protobuf::FieldDescriptorProto_Label)"
               );
}

Assistant:

void Parser::GenerateMapEntry(const MapField& map_field,
                              FieldDescriptorProto* field,
                              RepeatedPtrField<DescriptorProto>* messages) {
  DescriptorProto* entry = messages->Add();
  std::string entry_name = MapEntryName(field->name());
  field->set_type_name(entry_name);
  entry->set_name(entry_name);
  entry->mutable_options()->set_map_entry(true);
  FieldDescriptorProto* key_field = entry->add_field();
  key_field->set_name("key");
  key_field->set_label(FieldDescriptorProto::LABEL_OPTIONAL);
  key_field->set_number(1);
  if (map_field.key_type_name.empty()) {
    key_field->set_type(map_field.key_type);
  } else {
    key_field->set_type_name(map_field.key_type_name);
  }
  FieldDescriptorProto* value_field = entry->add_field();
  value_field->set_name("value");
  value_field->set_label(FieldDescriptorProto::LABEL_OPTIONAL);
  value_field->set_number(2);
  if (map_field.value_type_name.empty()) {
    value_field->set_type(map_field.value_type);
  } else {
    value_field->set_type_name(map_field.value_type_name);
  }
  // Propagate the "enforce_utf8" option to key and value fields if they
  // are strings. This helps simplify the implementation of code generators
  // and also reflection-based parsing code.
  //
  // The following definition:
  //   message Foo {
  //     map<string, string> value = 1 [enforce_utf8 = false];
  //   }
  // will be interpreted as:
  //   message Foo {
  //     message ValueEntry {
  //       option map_entry = true;
  //       string key = 1 [enforce_utf8 = false];
  //       string value = 2 [enforce_utf8 = false];
  //     }
  //     repeated ValueEntry value = 1 [enforce_utf8 = false];
  //  }
  //
  // TODO(xiaofeng): Remove this when the "enforce_utf8" option is removed
  // from protocol compiler.
  for (int i = 0; i < field->options().uninterpreted_option_size(); ++i) {
    const UninterpretedOption& option =
        field->options().uninterpreted_option(i);
    if (option.name_size() == 1 &&
        option.name(0).name_part() == "enforce_utf8" &&
        !option.name(0).is_extension()) {
      if (key_field->type() == FieldDescriptorProto::TYPE_STRING) {
        key_field->mutable_options()->add_uninterpreted_option()->CopyFrom(
            option);
      }
      if (value_field->type() == FieldDescriptorProto::TYPE_STRING) {
        value_field->mutable_options()->add_uninterpreted_option()->CopyFrom(
            option);
      }
    }
  }
}